

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

sockaddr_in6 *
sznet::net::sockets::sz_sock_getpeeraddr(sockaddr_in6 *__return_storage_ptr__,sz_sock sockfd)

{
  int iVar1;
  sockaddr *__addr;
  LogStream *this;
  SourceFile file;
  sockaddr_in6 *peeraddr;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  socklen_t local_10;
  int local_c;
  socklen_t addrlen;
  sz_sock sockfd_local;
  
  local_c = sockfd;
  memset(__return_storage_ptr__,0,0x1c);
  iVar1 = local_c;
  local_10 = 0x1c;
  __addr = sz_sockaddr_cast(__return_storage_ptr__);
  iVar1 = getpeername(iVar1,(sockaddr *)__addr,&local_10);
  if (iVar1 < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_ff0,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x171,false);
    this = Logger::stream(&local_fe0);
    LogStream::operator<<(this,"sockets::sz_sock_getpeeraddr");
    Logger::~Logger(&local_fe0);
  }
  return __return_storage_ptr__;
}

Assistant:

struct sockaddr_in6 sz_sock_getpeeraddr(sz_sock sockfd)
{
	struct sockaddr_in6 peeraddr;
	memset(&peeraddr, 0, sizeof(peeraddr));
	socklen_t addrlen = static_cast<socklen_t>(sizeof(peeraddr));
	if (::getpeername(sockfd, sz_sockaddr_cast(&peeraddr), &addrlen) < 0)
	{
		LOG_SYSERR << "sockets::sz_sock_getpeeraddr";
	}
	return peeraddr;
}